

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b.c
# Opt level: O1

int blake2b(void *out,size_t outlen,void *in,size_t inlen,void *key,size_t keylen)

{
  int iVar1;
  int iVar2;
  blake2b_state S;
  blake2b_state bStack_118;
  
  iVar2 = -1;
  if ((in != (void *)0x0 || inlen == 0) &&
     (0xffffffffffffffbf < outlen - 0x41 && out != (void *)0x0)) {
    if ((keylen < 0x41) && (key != (void *)0x0 || keylen == 0)) {
      if (keylen == 0) {
        iVar1 = blake2b_init(&bStack_118,outlen);
      }
      else {
        iVar1 = blake2b_init_key(&bStack_118,outlen,key,keylen);
      }
      if (-1 < iVar1) {
        iVar1 = blake2b_update(&bStack_118,in,inlen);
        if (-1 < iVar1) {
          iVar2 = blake2b_final(&bStack_118,out,outlen);
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int blake2b(void *out, size_t outlen, const void *in, size_t inlen,
	const void *key, size_t keylen) {
	blake2b_state S;
	int ret = -1;

	/* Verify parameters */
	if (NULL == in && inlen > 0) {
		goto fail;
	}

	if (NULL == out || outlen == 0 || outlen > BLAKE2B_OUTBYTES) {
		goto fail;
	}

	if ((NULL == key && keylen > 0) || keylen > BLAKE2B_KEYBYTES) {
		goto fail;
	}

	if (keylen > 0) {
		if (blake2b_init_key(&S, outlen, key, keylen) < 0) {
			goto fail;
		}
	}
	else {
		if (blake2b_init(&S, outlen) < 0) {
			goto fail;
		}
	}

	if (blake2b_update(&S, in, inlen) < 0) {
		goto fail;
	}
	ret = blake2b_final(&S, out, outlen);

fail:
	//clear_internal_memory(&S, sizeof(S));
	return ret;
}